

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O0

void __thiscall InstructionGenerator::genDynamicSetVariable(InstructionGenerator *this)

{
  Variable local_78;
  Variable local_48;
  Instruction local_14;
  InstructionGenerator *local_10;
  InstructionGenerator *this_local;
  
  local_14 = DYNAMIC_SET_VARIABLE;
  local_10 = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<Instruction>
            (this->bytecode,&local_14);
  VirtualStack::pop(&local_48,&this->super_VirtualStack);
  Variable::~Variable(&local_48);
  VirtualStack::pop(&local_78,&this->super_VirtualStack);
  Variable::~Variable(&local_78);
  return;
}

Assistant:

void InstructionGenerator::genDynamicSetVariable()
{
    bytecode->emplace_back(Instruction::DYNAMIC_SET_VARIABLE);
    pop();
    pop();
}